

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

void __thiscall cmFileLockPool::~cmFileLockPool(cmFileLockPool *this)

{
  cmFileLockPool *this_local;
  
  cmDeleteAll<std::vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>>
            (&this->FunctionScopes);
  cmDeleteAll<std::vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>>
            (&this->FileScopes);
  ScopePool::~ScopePool(&this->ProcessScope);
  std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::~vector
            (&this->FileScopes);
  std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::~vector
            (&this->FunctionScopes);
  return;
}

Assistant:

cmFileLockPool::~cmFileLockPool()
{
  cmDeleteAll(this->FunctionScopes);
  cmDeleteAll(this->FileScopes);
}